

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall pbrt::TransformCache::TransformCache(TransformCache *this)

{
  monotonic_buffer_resource *this_00;
  memory_resource *in_RDI;
  memory_resource *in_stack_ffffffffffffffc8;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffd0;
  polymorphic_allocator<std::byte> local_10 [2];
  
  if ((*(byte *)(Options + 0xf) & 1) == 0) {
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(in_stack_ffffffffffffffd0);
    this_00 = (monotonic_buffer_resource *)
              pstd::pmr::polymorphic_allocator<std::byte>::resource(local_10);
  }
  else {
    this_00 = (monotonic_buffer_resource *)
              pstd::pmr::polymorphic_allocator<std::byte>::resource
                        ((polymorphic_allocator<std::byte> *)&gpuMemoryAllocator);
  }
  pstd::pmr::monotonic_buffer_resource::monotonic_buffer_resource(this_00,in_stack_ffffffffffffffc8)
  ;
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)(in_RDI + 0xc),in_RDI);
  std::
  unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
  ::unordered_set((unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
                   *)0x451a7f);
  return;
}

Assistant:

TransformCache()
        : bufferResource(Options->useGPU ? gpuMemoryAllocator.resource()
                                         : Allocator().resource()),
          alloc(&bufferResource) {}